

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListenerImpl.cpp
# Opt level: O0

void SL::WS_LITE::Listen<SL::WS_LITE::WSListener_Configuration::listen(bool,bool)::__0&>
               (shared_ptr<SL::WS_LITE::HubContext> *listener,
               anon_class_1_0_00000001_for_socketcreator *socketcreator,bool no_delay,
               bool reuse_address)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer this;
  lowest_layer_type *peer;
  type local_78;
  undefined1 local_40 [8];
  shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  socket;
  value_type res;
  bool reuse_address_local;
  bool no_delay_local;
  anon_class_1_0_00000001_for_socketcreator *socketcreator_local;
  shared_ptr<SL::WS_LITE::HubContext> *listener_local;
  
  std::__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)listener);
  HubContext::getnextContext
            ((HubContext *)
             &socket.
              super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  remove_cv<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ListenerImpl.cpp:100:42)>
  ::type::anon_class_1_0_00000001_for_socketcreator::operator()
            ((anon_class_1_0_00000001_for_socketcreator *)local_40,
             (shared_ptr<SL::WS_LITE::ThreadContext> *)socketcreator);
  peVar1 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  peVar1->SocketStatus_ = CONNECTING;
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)listener);
  this = std::
         unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
         ::operator->(&peVar2->acceptor);
  peVar1 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  peer = asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>::lowest_layer(&peVar1->Socket)
  ;
  std::shared_ptr<SL::WS_LITE::HubContext>::shared_ptr(&local_78.listener,listener);
  std::
  shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  ::shared_ptr(&local_78.socket,
               (shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
                *)local_40);
  local_78.no_delay = no_delay;
  local_78.reuse_address = reuse_address;
  asio::basic_socket_acceptor<asio::ip::tcp>::
  async_accept<asio::ip::tcp,SL::WS_LITE::Listen<SL::WS_LITE::WSListener_Configuration::listen(bool,bool)::__0&>(std::shared_ptr<SL::WS_LITE::HubContext>const&,SL::WS_LITE::WSListener_Configuration::listen(bool,bool)::__0&,bool,bool)::_lambda(std::error_code_const&)_1_>
            (this,peer,&local_78,(type *)0x0);
  Listen<SL::WS_LITE::WSListener_Configuration::listen(bool,bool)::$_0&>(std::shared_ptr<SL::WS_LITE::HubContext>const&,SL::WS_LITE::WSListener_Configuration::listen(bool,bool)::$_0&,bool,bool)
  ::{lambda(std::error_code_const&)#1}::~error_code((_lambda_std__error_code_const___1_ *)&local_78)
  ;
  std::
  shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  ::~shared_ptr((shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
                 *)local_40);
  std::shared_ptr<SL::WS_LITE::ThreadContext>::~shared_ptr
            ((shared_ptr<SL::WS_LITE::ThreadContext> *)
             &socket.
              super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void Listen(const std::shared_ptr<HubContext> &listener, SOCKETCREATOR &&socketcreator, bool no_delay, bool reuse_address)
    {
        auto res = listener->getnextContext();
        auto socket = socketcreator(res);
        socket->SocketStatus_ = SocketStatus::CONNECTING;
        listener->acceptor->async_accept(socket->Socket.lowest_layer(),
                                         [listener, socket, socketcreator, no_delay, reuse_address](const std::error_code &ec) {
                                             std::error_code e;
                                             socket->Socket.lowest_layer().set_option(asio::socket_base::reuse_address(reuse_address), e);
                                             if (e) {
                                                 SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "set_option reuse_address error " << e.message());
                                                 e.clear();
                                             }
                                             socket->Socket.lowest_layer().set_option(asio::ip::tcp::no_delay(no_delay), e);
                                             if (e) {
                                                 SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "set_option no_delay error " << e.message());
                                                 e.clear();
                                             }
                                             if (!ec) {
                                                 async_handshake(listener, socket);
                                             }
                                             else {
                                                 socket->SocketStatus_ = SocketStatus::CLOSED;
                                             }
                                             Listen(listener, socketcreator, no_delay, reuse_address);
                                         });
    }